

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_round(Context *context,IntrinsicResult partialResult)

{
  bool *pbVar1;
  anon_union_8_3_2f476f46_for_data aVar2;
  ValueType VVar3;
  Value *pVVar4;
  int32_t iVar5;
  long *plVar6;
  undefined2 *puVar7;
  _func_int **pp_Var8;
  _func_int *p_Var9;
  double dVar10;
  undefined1 local_90 [8];
  anon_union_8_3_2f476f46_for_data local_88;
  anon_union_8_3_2f476f46_for_data local_80;
  _func_int **local_78;
  char local_70;
  long *local_68;
  char local_60;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_58;
  Value local_50;
  Value local_40;
  
  local_60 = '\0';
  plVar6 = (long *)operator_new(0x30);
  plVar6[1] = 1;
  *plVar6 = (long)&PTR__StringStorage_001d10b0;
  plVar6[3] = 2;
  plVar6[4] = -1;
  puVar7 = (undefined2 *)operator_new__(2);
  plVar6[2] = (long)puVar7;
  *puVar7 = 0;
  *puVar7 = 0x78;
  local_68 = plVar6;
  Context::GetVar((Context *)local_90,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  local_80 = local_88;
  if (local_90[0] != Number) {
    local_80.number = 0.0;
  }
  if ((Temp < local_90[0]) && (local_88.ref != (RefCountedStorage *)0x0)) {
    plVar6 = &(local_88.ref)->refCount;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (*(local_88.ref)->_vptr_RefCountedStorage[1])();
    }
    local_88.number = 0.0;
  }
  if ((local_68 != (long *)0x0) && (local_60 == '\0')) {
    plVar6 = local_68 + 1;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (**(code **)(*local_68 + 8))();
    }
    local_68 = (long *)0x0;
  }
  local_70 = '\0';
  pp_Var8 = (_func_int **)operator_new(0x30);
  pp_Var8[1] = (_func_int *)0x1;
  *pp_Var8 = (_func_int *)&PTR__StringStorage_001d10b0;
  pp_Var8[3] = (_func_int *)0xe;
  pp_Var8[4] = (_func_int *)0xffffffffffffffff;
  p_Var9 = (_func_int *)operator_new__(0xe);
  pp_Var8[2] = p_Var9;
  *(undefined8 *)(p_Var9 + 6) = 0x736563616c506c;
  *(undefined8 *)p_Var9 = 0x506c616d69636564;
  local_78 = pp_Var8;
  Context::GetVar((Context *)local_90,(String *)partialResult.rs,(LocalOnlyMode)&local_78);
  iVar5 = Value::IntValue((Value *)local_90);
  if ((Temp < local_90[0]) && (local_88.ref != (RefCountedStorage *)0x0)) {
    plVar6 = &(local_88.ref)->refCount;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (*(local_88.ref)->_vptr_RefCountedStorage[1])();
    }
    local_88.number = 0.0;
  }
  if ((local_78 != (_func_int **)0x0) && (local_70 == '\0')) {
    pp_Var8 = local_78 + 1;
    *pp_Var8 = *pp_Var8 + -1;
    if (*pp_Var8 == (_func_int *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (_func_int **)0x0;
  }
  if (iVar5 == 0) {
    local_40.data.number = round(local_80.number);
    pVVar4 = &local_40;
    local_40.type = Number;
    local_40.noInvoke = false;
    local_40.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_40);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar2 = local_40.data;
    VVar3 = local_40.type;
  }
  else {
    local_58 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)pow(10.0,(double)iVar5);
    dVar10 = round(local_80.number * (double)local_58);
    local_50.data.number = dVar10 / (double)local_58;
    pVVar4 = &local_50;
    local_50.type = Number;
    local_50.noInvoke = false;
    local_50.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_50);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar2 = local_50.data;
    VVar3 = local_50.type;
  }
  if ((2 < VVar3) && ((Context *)aVar2.ref != (Context *)0x0)) {
    pbVar1 = (bool *)&(aVar2.ref)->refCount;
    *(long *)pbVar1 = *(long *)pbVar1 + -1;
    if (*(long *)pbVar1 == 0) {
      (*((RefCountedStorage *)&(aVar2.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])();
    }
    (pVVar4->data).number = 0.0;
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_round(Context *context, IntrinsicResult partialResult) {
		double num = context->GetVar("x").DoubleValue();
		long decimalPlaces = context->GetVar("decimalPlaces").IntValue();
		if (decimalPlaces == 0) return IntrinsicResult(round(num));	// easy case
		double f = pow(10, decimalPlaces);
		return IntrinsicResult(round(num*f) / f);
	}